

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O0

int space_mixer_mix(mixed_segment *segment)

{
  mixed_buffer *pmVar1;
  void *__s;
  undefined8 *puVar2;
  long lVar3;
  float *pfVar4;
  uint32_t uVar5;
  long *plVar6;
  ulong uVar7;
  float **area;
  long lVar8;
  undefined8 uStack_90;
  long local_88;
  byte local_79;
  uint local_78;
  float fStack_74;
  mixed_channel_t c_3;
  uint32_t i;
  float volume;
  float *out;
  undefined8 *puStack_60;
  mixed_channel_t c_2;
  space_source *source_1;
  uint32_t s_1;
  mixed_channel_t c_1;
  space_source *source;
  byte local_3d;
  uint32_t s;
  mixed_channel_t c;
  float *pfStack_38;
  float global_volume;
  float *in;
  unsigned_long __vla_expr0;
  uint local_20;
  uint32_t local_1c;
  uint32_t channels;
  uint32_t samples;
  space_mixer_data *data;
  mixed_segment *segment_local;
  
  __vla_expr0 = (unsigned_long)&local_88;
  _channels = (long *)segment->data;
  local_1c = 0xffffffff;
  local_20 = (uint)*(byte *)((long)_channels + 0x542c);
  in = (float *)(ulong)local_20;
  lVar3 = -((long)in * 8 + 0xfU & 0xfffffffffffffff0);
  local_88 = (long)&local_88 + lVar3;
  s = *(uint32_t *)(_channels + 0xaa1);
  data = (space_mixer_data *)segment;
  for (local_3d = 0; local_3d < local_20; local_3d = local_3d + 1) {
    area = (float **)(local_88 + (ulong)local_3d * 8);
    pmVar1 = *(mixed_buffer **)(_channels[2] + (ulong)local_3d * 8);
    *(undefined8 *)((long)&uStack_90 + lVar3) = 0x1ed7ed;
    mixed_buffer_request_write(area,&local_1c,pmVar1);
  }
  for (source._4_4_ = 0; source._4_4_ < *(uint *)(_channels + 1); source._4_4_ = source._4_4_ + 1) {
    _s_1 = *(undefined8 **)(*_channels + (ulong)source._4_4_ * 8);
    if (_s_1 != (undefined8 *)0x0) {
      pmVar1 = (mixed_buffer *)*_s_1;
      *(undefined8 *)((long)&uStack_90 + lVar3) = 0x1ed839;
      mixed_buffer_request_read(&stack0xffffffffffffffc8,&local_1c,pmVar1);
      if (local_1c == 0) break;
    }
  }
  if (local_1c != 0) {
    for (source_1._7_1_ = 0; source_1._7_1_ < local_20; source_1._7_1_ = source_1._7_1_ + 1) {
      __s = *(void **)(local_88 + (ulong)source_1._7_1_ * 8);
      uVar7 = (ulong)local_1c;
      *(undefined8 *)((long)&uStack_90 + lVar3) = 0x1ed882;
      memset(__s,0,uVar7 << 2);
    }
    for (source_1._0_4_ = 0; plVar6 = _channels, (uint)source_1 < *(uint *)(_channels + 1);
        source_1._0_4_ = (uint)source_1 + 1) {
      puVar2 = *(undefined8 **)(*_channels + (ulong)(uint)source_1 * 8);
      puStack_60 = puVar2;
      if (puVar2 != (undefined8 *)0x0) {
        if ((*(byte *)(puVar2 + 0x1b) & 1) != 0) {
          *(undefined8 *)((long)&uStack_90 + lVar3) = 0x1ed8db;
          calculate_volumes_ifunc(puVar2,plVar6);
          plVar6 = _channels;
          puVar2 = puStack_60;
          *(undefined8 *)((long)&uStack_90 + lVar3) = 0x1ed8e8;
          calculate_pitch_shift_ifunc(puVar2,plVar6);
          *(undefined1 *)(puStack_60 + 0x1b) = 0;
        }
        pmVar1 = (mixed_buffer *)*puStack_60;
        *(undefined8 *)((long)&uStack_90 + lVar3) = 0x1ed907;
        mixed_buffer_request_read(&stack0xffffffffffffffc8,&local_1c,pmVar1);
        uVar5 = local_1c;
        pfVar4 = pfStack_38;
        if ((*(float *)((long)puStack_60 + 0xd4) != 1.0) ||
           (NAN(*(float *)((long)puStack_60 + 0xd4)))) {
          plVar6 = _channels + 0xa8a;
          lVar8 = (long)puStack_60 + 0xd4;
          *(undefined8 *)((long)&uStack_90 + lVar3) = 0x1ed956;
          fft_window_resolver(pfVar4,pfVar4,uVar5,plVar6,fft_pitch_shift_resolver,lVar8);
        }
        uVar5 = local_1c;
        for (out._7_1_ = 0; out._7_1_ < *(byte *)((long)puStack_60 + 0xd1);
            out._7_1_ = out._7_1_ + 1) {
          _i = *(long *)(local_88 + (ulong)*(byte *)((long)puStack_60 + (ulong)out._7_1_ + 0xb0) * 8
                        );
          fStack_74 = (float)s * *(float *)((long)puStack_60 + (ulong)out._7_1_ * 4 + 0x2c);
          for (local_78 = 0; local_78 < local_1c; local_78 = local_78 + 1) {
            *(float *)(_i + (ulong)local_78 * 4) =
                 fStack_74 * pfStack_38[local_78] + *(float *)(_i + (ulong)local_78 * 4);
          }
        }
        pmVar1 = (mixed_buffer *)*puStack_60;
        *(undefined8 *)((long)&uStack_90 + lVar3) = 0x1eda07;
        mixed_buffer_finish_read(uVar5,pmVar1);
      }
    }
  }
  for (local_79 = 0; uVar5 = local_1c, local_79 < local_20; local_79 = local_79 + 1) {
    pmVar1 = *(mixed_buffer **)(_channels[2] + (ulong)local_79 * 8);
    *(undefined8 *)((long)&uStack_90 + lVar3) = 0x1eda3c;
    mixed_buffer_finish_write(uVar5,pmVar1);
  }
  return 1;
}

Assistant:

VECTORIZE int space_mixer_mix(struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  uint32_t samples = UINT32_MAX;
  uint32_t channels = data->channels.count;
  float *restrict outs[channels], *restrict in;
  float global_volume = data->volume;
  
  // Compute sample counts
  for(mixed_channel_t c=0; c<channels; ++c){
    mixed_buffer_request_write(&outs[c], &samples, data->out[c]);
  }
  for(uint32_t s=0; s<data->count; ++s){
    struct space_source *source = data->sources[s];
    if(!source) continue;

    mixed_buffer_request_read(&in, &samples, source->buffer);
    if(samples == 0) break;
  }

  if(0 < samples){
    for(mixed_channel_t c=0; c<channels; ++c){
      memset(outs[c], 0, samples*sizeof(float));
    }
    for(uint32_t s=0; s<data->count; ++s){
      struct space_source *source = data->sources[s];
      if(!source) continue;
      
      if(source->dirty){
        calculate_volumes(source, data);
        calculate_pitch_shift(source, data);
        source->dirty = 0;
      }

      mixed_buffer_request_read(&in, &samples, source->buffer);
      if(source->pitch != 1.0)
        fft_window(in, in, samples, &data->fft_window_data, fft_pitch_shift, &source->pitch);
      for(mixed_channel_t c=0; c<source->speaker_count; ++c){
        float *restrict out = outs[source->speakers[c]];
        float volume = global_volume*source->volumes[c];
        for(uint32_t i=0; i<samples; ++i){
          out[i] += volume * in[i];
        }
      }
      mixed_buffer_finish_read(samples, source->buffer);
    }
  }
  for(mixed_channel_t c=0; c<channels; ++c){
    mixed_buffer_finish_write(samples, data->out[c]);
  };
  return 1;
}